

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O0

bool canConvertMetaObject(QMetaType fromType,QMetaType toType)

{
  long lVar1;
  bool bVar2;
  QFlags<QMetaType::TypeFlag> lhs;
  QFlags<QMetaType::TypeFlag> rhs;
  QMetaObject *this;
  QMetaObject *metaObject;
  long in_FS_OFFSET;
  QMetaObject *t;
  QMetaObject *f;
  TypeFlag in_stack_ffffffffffffffbc;
  QMetaType *in_stack_ffffffffffffffc0;
  bool local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMetaType::flags(in_stack_ffffffffffffffc0);
  lhs = QFlags<QMetaType::TypeFlag>::operator&
                  ((QFlags<QMetaType::TypeFlag> *)in_stack_ffffffffffffffc0,
                   in_stack_ffffffffffffffbc);
  QMetaType::flags(in_stack_ffffffffffffffc0);
  rhs = QFlags<QMetaType::TypeFlag>::operator&
                  ((QFlags<QMetaType::TypeFlag> *)in_stack_ffffffffffffffc0,
                   in_stack_ffffffffffffffbc);
  bVar2 = operator!=(lhs,rhs);
  if (bVar2) {
    local_21 = false;
  }
  else {
    this = QMetaType::metaObject(in_stack_ffffffffffffffc0);
    metaObject = QMetaType::metaObject(in_stack_ffffffffffffffc0);
    if ((this == (QMetaObject *)0x0) || (metaObject == (QMetaObject *)0x0)) {
      local_21 = false;
    }
    else {
      bVar2 = QMetaObject::inherits(this,metaObject);
      local_21 = true;
      if (!bVar2) {
        local_21 = QMetaObject::inherits(this,metaObject);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_21;
}

Assistant:

static bool canConvertMetaObject(QMetaType fromType, QMetaType toType)
{
    if ((fromType.flags() & QMetaType::IsPointer) != (toType.flags() & QMetaType::IsPointer))
        return false; // Can not convert between pointer and value

    const QMetaObject *f = fromType.metaObject();
    const QMetaObject *t = toType.metaObject();
    if (f && t) {
        return f->inherits(t) || (t->inherits(f));
    }
    return false;
}